

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_compress.cpp
# Opt level: O3

size_t duckdb_zstd::HUF_buildCTable_wksp
                 (HUF_CElt *CTable,uint *count,U32 maxSymbolValue,U32 maxNbBits,void *workSpace,
                 size_t wkspSize)

{
  short *psVar1;
  byte bVar2;
  byte bVar3;
  undefined4 *puVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  short sVar8;
  uint uVar9;
  uint uVar10;
  size_t sVar11;
  byte bVar12;
  int iVar13;
  uint uVar14;
  long lVar15;
  char *pcVar16;
  ulong uVar17;
  byte *pbVar18;
  int iVar19;
  ulong uVar20;
  ulong uVar21;
  long lVar22;
  ushort uVar23;
  int iVar24;
  undefined1 *puVar25;
  uint uVar26;
  int iVar27;
  ulong uVar28;
  int iVar29;
  int iVar30;
  uint uVar31;
  long lVar32;
  ulong uVar33;
  ulong uVar34;
  undefined4 *__s;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  U16 nbPerRank [13];
  short sStack_aa;
  uint local_a8 [2];
  undefined2 uStack_a0;
  undefined6 uStack_9e;
  undefined8 local_98;
  undefined2 uStack_90;
  undefined6 uStack_8e;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  ulong local_68;
  undefined8 local_60;
  unkbyte10 Stack_58;
  undefined6 local_4e;
  unkbyte10 Stack_48;
  
  uVar20 = (ulong)(-(int)workSpace & 3);
  __s = (undefined4 *)((long)workSpace + uVar20);
  puVar4 = (undefined4 *)(wkspSize - uVar20);
  if (wkspSize < uVar20) {
    __s = (undefined4 *)0x0;
    puVar4 = (undefined4 *)0x0;
  }
  sVar11 = 0xffffffffffffffbe;
  if (((undefined4 *)0x12ff < puVar4) && (sVar11 = 0xffffffffffffffd2, maxSymbolValue < 0x100)) {
    uVar34 = (ulong)(maxSymbolValue + 1);
    uVar20 = 0;
    switchD_00569a20::default(__s,0,0x1300);
    do {
      uVar9 = count[uVar20];
      uVar26 = 0x1f;
      if (uVar9 != 0) {
        for (; uVar9 >> uVar26 == 0; uVar26 = uVar26 - 1) {
        }
      }
      uVar26 = (uVar26 ^ 0xffffffe0) + 0xbe;
      if (uVar9 < 0xa5) {
        uVar26 = uVar9;
      }
      *(short *)(__s + (ulong)uVar26 + 0x400) = *(short *)(__s + (ulong)uVar26 + 0x400) + 1;
      uVar20 = uVar20 + 1;
    } while (uVar34 != uVar20);
    sVar8 = *(short *)(__s + 0x4bf);
    lVar15 = 0x4be;
    do {
      sVar8 = sVar8 + *(short *)(__s + lVar15);
      *(short *)(__s + lVar15) = sVar8;
      *(short *)((long)__s + lVar15 * 4 + 2) = sVar8;
      lVar15 = lVar15 + -1;
    } while (lVar15 != 0x3ff);
    uVar20 = 0;
    do {
      uVar9 = count[uVar20];
      uVar26 = 0x1f;
      if (uVar9 != 0) {
        for (; uVar9 >> uVar26 == 0; uVar26 = uVar26 - 1) {
        }
      }
      uVar26 = (uVar26 ^ 0xffffffe0) + 0xbe;
      if (uVar9 < 0xa5) {
        uVar26 = uVar9;
      }
      uVar23 = *(ushort *)((long)__s + (ulong)uVar26 * 4 + 0x1006);
      *(ushort *)((long)__s + (ulong)uVar26 * 4 + 0x1006) = uVar23 + 1;
      __s[(ulong)uVar23 * 2 + 2] = uVar9;
      *(char *)((long)__s + (ulong)uVar23 * 8 + 0xe) = (char)uVar20;
      uVar20 = uVar20 + 1;
    } while (uVar34 != uVar20);
    lVar15 = 0x4a5;
    do {
      iVar19 = (uint)*(ushort *)((long)__s + lVar15 * 4 + 2) - (uint)*(ushort *)(__s + lVar15);
      if (1 < iVar19) {
        HUF_simpleQuickSort((nodeElt *)(__s + (ulong)*(ushort *)(__s + lVar15) * 2 + 2),0,
                            iVar19 + -1);
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 != 0x4bf);
    local_60 = (ulong)maxSymbolValue;
    lVar15 = (local_60 << 0x20) + 0x100000000;
    lVar32 = 0;
    do {
      lVar22 = lVar32 * 2;
      lVar32 = lVar32 + -1;
      lVar15 = lVar15 + -0x100000000;
    } while (__s[local_60 * 2 + lVar22 + 2] == 0);
    uVar9 = 0xb;
    if (maxNbBits != 0) {
      uVar9 = maxNbBits;
    }
    uVar28 = local_60 + lVar32 + 1;
    uVar20 = local_60 + lVar32 + 0x100;
    __s[0x202] = __s[local_60 * 2 + lVar22 + 2] + __s[local_60 * 2 + lVar32 * 2 + 2];
    *(undefined2 *)(__s + local_60 * 2 + lVar32 * 2 + 3) = 0x100;
    *(undefined2 *)(__s + local_60 * 2 + lVar32 * 2 + 5) = 0x100;
    auVar7 = _DAT_0132e0c0;
    auVar6 = _DAT_012acff0;
    auVar5 = _DAT_012acfe0;
    iVar19 = (int)uVar20;
    if ((long)uVar28 < 2) {
      *__s = 0x80000000;
      *(undefined1 *)((long)__s + (long)iVar19 * 8 + 0xf) = 0;
    }
    else {
      uVar17 = (ulong)(maxSymbolValue - 1) + lVar32;
      uVar33 = 0x101;
      if (0x101 < iVar19) {
        uVar33 = uVar20 & 0xffffffff;
      }
      local_68 = local_60 + 0xff + lVar32;
      lVar22 = uVar33 - 0x101;
      auVar35._8_4_ = (int)lVar22;
      auVar35._0_8_ = lVar22;
      auVar35._12_4_ = (int)((ulong)lVar22 >> 0x20);
      uVar21 = 0;
      auVar35 = auVar35 ^ _DAT_012acff0;
      do {
        auVar36._8_4_ = (int)uVar21;
        auVar36._0_8_ = uVar21;
        auVar36._12_4_ = (int)(uVar21 >> 0x20);
        auVar37 = (auVar36 | auVar5) ^ auVar6;
        iVar30 = auVar35._4_4_;
        if ((bool)(~(auVar37._4_4_ == iVar30 && auVar35._0_4_ < auVar37._0_4_ ||
                    iVar30 < auVar37._4_4_) & 1)) {
          __s[uVar21 * 2 + 0x204] = 0x40000000;
        }
        if ((auVar37._12_4_ != auVar35._12_4_ || auVar37._8_4_ <= auVar35._8_4_) &&
            auVar37._12_4_ <= auVar35._12_4_) {
          __s[uVar21 * 2 + 0x206] = 0x40000000;
        }
        auVar36 = (auVar36 | auVar7) ^ auVar6;
        iVar24 = auVar36._4_4_;
        if (iVar24 <= iVar30 && (iVar24 != iVar30 || auVar36._0_4_ <= auVar35._0_4_)) {
          __s[uVar21 * 2 + 0x208] = 0x40000000;
          __s[uVar21 * 2 + 0x20a] = 0x40000000;
        }
        uVar21 = uVar21 + 4;
      } while ((uVar33 - 0xfd & 0xfffffffffffffffc) != uVar21);
      uVar33 = 0x101;
      if (0x101 < iVar19) {
        uVar33 = uVar20 & 0xffffffff;
      }
      *__s = 0x80000000;
      iVar30 = 0x100;
      lVar22 = 0;
      do {
        iVar13 = (int)uVar17;
        uVar26 = __s[(long)iVar13 * 2 + 2];
        uVar31 = __s[(long)iVar30 * 2 + 2];
        iVar24 = (iVar30 + 1) - (uint)(uVar26 < uVar31);
        iVar29 = iVar30;
        if (uVar26 < uVar31) {
          iVar29 = iVar13;
        }
        uVar10 = (uint)(uVar26 < uVar31);
        iVar27 = iVar13 - uVar10;
        uVar26 = __s[(long)iVar27 * 2 + 2];
        uVar31 = __s[(long)iVar24 * 2 + 2];
        iVar30 = (iVar24 + 1) - (uint)(uVar26 < uVar31);
        uVar17 = (ulong)((iVar13 - uVar10) - (uint)(uVar26 < uVar31));
        if (uVar26 < uVar31) {
          iVar24 = iVar27;
        }
        __s[lVar22 * 2 + 0x204] = __s[(long)iVar24 * 2 + 2] + __s[(long)iVar29 * 2 + 2];
        sVar8 = (short)lVar22 + 0x101;
        *(short *)(__s + (long)iVar24 * 2 + 3) = sVar8;
        *(short *)(__s + (long)iVar29 * 2 + 3) = sVar8;
        lVar22 = lVar22 + 1;
      } while (uVar33 - 0x100 != lVar22);
      *(undefined1 *)((long)__s + (long)iVar19 * 8 + 0xf) = 0;
      pcVar16 = (char *)((long)__s + (local_68 & 0xffffffff) * 8 + 0xf);
      do {
        *pcVar16 = *(char *)((long)__s + (ulong)*(ushort *)(pcVar16 + -3) * 8 + 0xf) + '\x01';
        uVar26 = (int)uVar20 - 1;
        uVar20 = (ulong)uVar26;
        pcVar16 = pcVar16 + -8;
      } while (0x100 < (int)uVar26);
    }
    uVar20 = local_60 + lVar32 + 2;
    if (-1 < (long)uVar28) {
      uVar17 = 0;
      do {
        *(char *)((long)__s + uVar17 * 8 + 0xf) =
             *(char *)((long)__s + (ulong)*(ushort *)(__s + uVar17 * 2 + 3) * 8 + 0xf) + '\x01';
        uVar17 = uVar17 + 1;
      } while ((uVar20 & 0xffffffff) != uVar17);
    }
    iVar19 = (int)uVar28;
    bVar2 = *(byte *)((long)__s + (uVar28 & 0xffffffff) * 8 + 0xf);
    uVar26 = (uint)bVar2;
    if (uVar9 <= uVar26 && uVar26 - uVar9 != 0) {
      bVar12 = (byte)(uVar26 - uVar9);
      bVar3 = *(byte *)((long)__s + (lVar15 >> 0x1d) + 0xf);
      uVar26 = (uint)bVar3;
      if (uVar9 < bVar3) {
        iVar19 = (int)lVar32 + maxSymbolValue + 1;
        puVar25 = (undefined1 *)((long)__s + (long)iVar19 * 8 + 0xf);
        lVar15 = (long)iVar19 << 0x20;
        iVar30 = 0;
        do {
          iVar30 = (-1 << (bVar2 - (char)uVar26 & 0x1f)) + iVar30 + (1 << (bVar12 & 0x1f));
          *puVar25 = (char)uVar9;
          uVar26 = (uint)(byte)puVar25[-8];
          puVar25 = puVar25 + -8;
          lVar15 = lVar15 + -0x100000000;
          iVar19 = iVar19 + -1;
        } while (uVar9 < uVar26);
      }
      else {
        iVar30 = 0;
      }
      uVar26 = iVar19 + 1;
      lVar15 = (lVar15 >> 0x20) + 1;
      do {
        lVar32 = lVar15 * 8;
        uVar26 = uVar26 - 1;
        lVar15 = lVar15 + -1;
      } while (uVar9 == *(byte *)((long)__s + lVar32 + 7));
      uVar31 = iVar30 >> (bVar12 & 0x1f);
      local_78 = 0xf0f0f0f0f0f0f0f0;
      local_88 = 0xf0f0f0f0f0f0f0f0;
      uStack_80 = 0xf0f0f0f0f0f0f0f0;
      local_98 = 0xf0f0f0f0f0f0f0f0;
      uStack_90 = 0xf0f0;
      uStack_8e = 0xf0f0f0f0f0f0;
      local_a8[0] = 0xf0f0f0f0;
      local_a8[1] = 0xf0f0f0f0;
      uStack_a0 = 0xf0f0;
      uStack_9e = 0xf0f0f0f0f0f0;
      if (-1 < lVar15) {
        uVar17 = (ulong)uVar26;
        pbVar18 = (byte *)((long)__s + uVar17 * 8 + 0xf);
        uVar26 = uVar9;
        do {
          uVar10 = (uint)uVar17;
          if (*pbVar18 < uVar26) {
            uVar26 = (uint)*pbVar18;
            local_a8[uVar9 - uVar26] = uVar10;
          }
          uVar17 = uVar17 - 1;
          pbVar18 = pbVar18 + -8;
        } while (0 < (int)uVar10);
      }
      for (; 0 < (int)uVar31; uVar31 = (-1 << ((byte)uVar14 & 0x1f)) + uVar31) {
        uVar26 = 0x1f;
        if (uVar31 != 0) {
          for (; uVar31 >> uVar26 == 0; uVar26 = uVar26 - 1) {
          }
        }
        if ((uVar26 ^ 0x1f) != 0x1f) {
          uVar17 = (ulong)(0x20 - (uVar26 ^ 0x1f));
          do {
            uVar33 = uVar17 - 1;
            if (((ulong)local_a8[uVar17] != 0xf0f0f0f0) &&
               ((local_a8[uVar33 & 0xffffffff] == 0xf0f0f0f0 ||
                ((uint)__s[(ulong)local_a8[uVar17] * 2 + 2] <=
                 (uint)(__s[(ulong)local_a8[uVar33 & 0xffffffff] * 2 + 2] * 2))))) {
              if (uVar17 < 0xd) goto LAB_0127111a;
              goto LAB_0127113c;
            }
            uVar17 = uVar33;
          } while ((uVar33 & 0xfffffffe) != 0);
        }
        uVar17 = 1;
LAB_0127111a:
        do {
          if (local_a8[uVar17] != 0xf0f0f0f0) goto LAB_0127113c;
          uVar17 = uVar17 + 1;
        } while (uVar17 != 0xd);
        uVar17 = 0xd;
LAB_0127113c:
        uVar14 = (int)uVar17 - 1;
        uVar26 = local_a8[uVar17 & 0xffffffff];
        pcVar16 = (char *)((long)__s + (ulong)uVar26 * 8 + 0xf);
        *pcVar16 = *pcVar16 + '\x01';
        uVar10 = local_a8[uVar14];
        if (local_a8[uVar14] == 0xf0f0f0f0) {
          uVar10 = uVar26;
        }
        local_a8[uVar14] = uVar10;
        if ((ulong)uVar26 == 0) {
          uVar26 = 0xf0f0f0f0;
        }
        else {
          uVar26 = uVar26 - 1;
          if (uVar9 - (int)uVar17 != (uint)*(byte *)((long)__s + (ulong)uVar26 * 8 + 0xf)) {
            uVar26 = 0xf0f0f0f0;
          }
        }
        local_a8[uVar17 & 0xffffffff] = uVar26;
      }
      uVar26 = uVar9;
      if ((int)uVar31 < 0) {
        do {
          uVar10 = local_a8[1] + 0xf0f0f10;
          uVar14 = 0;
          while( true ) {
            local_a8[1] = local_a8[1] + 1;
            if (uVar10 == uVar14) break;
            pcVar16 = (char *)((long)__s + (ulong)local_a8[1] * 8 + 0xf);
            *pcVar16 = *pcVar16 + -1;
            uVar14 = uVar14 - 1;
            if (uVar31 == uVar14) goto LAB_012711bb;
          }
          iVar19 = (int)lVar15;
          iVar30 = uVar31 - uVar14;
          lVar15 = (long)iVar19 + 1;
          local_a8[1] = iVar19 + 2;
          do {
            lVar32 = lVar15 * 8;
            lVar15 = lVar15 + -1;
            local_a8[1] = local_a8[1] - 1;
          } while (uVar9 == *(byte *)((long)__s + lVar32 + 7));
          pcVar16 = (char *)((long)__s + (long)(int)local_a8[1] * 8 + 0xf);
          *pcVar16 = *pcVar16 + -1;
          uVar31 = iVar30 + 1;
        } while (iVar30 < -1);
      }
    }
LAB_012711bb:
    sVar11 = 0xffffffffffffffff;
    if (uVar26 < 0xd) {
      local_98 = 0;
      uStack_90 = 0;
      local_a8[0] = 0;
      local_a8[1] = 0;
      uStack_a0 = 0;
      uStack_9e = 0;
      Stack_48 = SUB1610((undefined1  [16])0x0,6);
      Stack_58 = SUB1610((undefined1  [16])0x0,0);
      local_4e = 0;
      if (-1 < (long)uVar28) {
        uVar28 = 0;
        do {
          psVar1 = (short *)((long)local_a8 + (ulong)*(byte *)((long)__s + uVar28 * 8 + 0xf) * 2);
          *psVar1 = *psVar1 + 1;
          uVar28 = uVar28 + 1;
        } while ((uVar20 & 0xffffffff) != uVar28);
      }
      sVar11 = (size_t)uVar26;
      if (uVar26 != 0) {
        uVar20 = sVar11 + 1;
        uVar23 = 0;
        do {
          *(ushort *)((long)&local_60 + uVar20 * 2 + 6) = uVar23;
          uVar23 = (ushort)(uVar23 + (&sStack_aa)[uVar20]) >> 1;
          uVar20 = uVar20 - 1;
        } while (1 < uVar20);
      }
      uVar20 = 0;
      do {
        CTable[(ulong)*(byte *)((long)__s + uVar20 * 8 + 0xe) + 1] =
             (ulong)*(byte *)((long)__s + uVar20 * 8 + 0xf);
        uVar20 = uVar20 + 1;
      } while (uVar34 != uVar20);
      uVar20 = 0;
      do {
        uVar28 = CTable[uVar20 + 1];
        uVar17 = uVar28 & 0xff;
        uVar23 = *(ushort *)((long)&Stack_58 + uVar17 * 2);
        *(ushort *)((long)&Stack_58 + uVar17 * 2) = uVar23 + 1;
        if (uVar17 != 0) {
          CTable[uVar20 + 1] = (ulong)uVar23 << (-(char)uVar28 & 0x3fU) | uVar28;
        }
        uVar20 = uVar20 + 1;
      } while (uVar34 != uVar20);
      *(char *)CTable = (char)uVar26;
      *(char *)((long)CTable + 1) = (char)maxSymbolValue;
      *(undefined4 *)((long)CTable + 2) = 0;
      *(undefined2 *)((long)CTable + 6) = 0;
    }
  }
  return sVar11;
}

Assistant:

size_t
HUF_buildCTable_wksp(HUF_CElt* CTable, const unsigned* count, U32 maxSymbolValue, U32 maxNbBits,
                     void* workSpace, size_t wkspSize)
{
    HUF_buildCTable_wksp_tables* const wksp_tables =
        (HUF_buildCTable_wksp_tables*)HUF_alignUpWorkspace(workSpace, &wkspSize, ZSTD_ALIGNOF(U32));
    nodeElt* const huffNode0 = wksp_tables->huffNodeTbl;
    nodeElt* const huffNode = huffNode0+1;
    int nonNullRank;

    HUF_STATIC_ASSERT(HUF_CTABLE_WORKSPACE_SIZE == sizeof(HUF_buildCTable_wksp_tables));

    DEBUGLOG(5, "HUF_buildCTable_wksp (alphabet size = %u)", maxSymbolValue+1);

    /* safety checks */
    if (wkspSize < sizeof(HUF_buildCTable_wksp_tables))
        return ERROR(workSpace_tooSmall);
    if (maxNbBits == 0) maxNbBits = HUF_TABLELOG_DEFAULT;
    if (maxSymbolValue > HUF_SYMBOLVALUE_MAX)
        return ERROR(maxSymbolValue_tooLarge);
    ZSTD_memset(huffNode0, 0, sizeof(huffNodeTable));

    /* sort, decreasing order */
    HUF_sort(huffNode, count, maxSymbolValue, wksp_tables->rankPosition);
    DEBUGLOG(6, "sorted symbols completed (%zu symbols)", showHNodeSymbols(huffNode, maxSymbolValue+1));

    /* build tree */
    nonNullRank = HUF_buildTree(huffNode, maxSymbolValue);

    /* determine and enforce maxTableLog */
    maxNbBits = HUF_setMaxHeight(huffNode, (U32)nonNullRank, maxNbBits);
    if (maxNbBits > HUF_TABLELOG_MAX) return ERROR(GENERIC);   /* check fit into table */

    HUF_buildCTableFromTree(CTable, huffNode, nonNullRank, maxSymbolValue, maxNbBits);

    return maxNbBits;
}